

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

void print_snifline(int slot)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  size_t __n;
  long lVar9;
  char *__format;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  lVar4 = (long)slot;
  lVar12 = lVar4 * 0x158;
  lVar7 = sniftab[lVar4].currstamp.tv_usec - sniftab[lVar4].laststamp.tv_usec;
  bVar1 = sniftab[lVar4].last.len;
  bVar2 = sniftab[lVar4].current.len;
  lVar8 = lVar7 + 1000000;
  if (-1 < lVar7) {
    lVar8 = lVar7;
  }
  lVar7 = (lVar7 >> 0x3f) + (sniftab[lVar4].currstamp.tv_sec - sniftab[lVar4].laststamp.tv_sec);
  if (lVar7 < 0) {
    lVar8 = 0;
  }
  uVar11 = sniftab[lVar4].current.can_id;
  lVar9 = 0;
  if (0 < lVar7) {
    lVar9 = lVar7;
  }
  lVar5 = 999999;
  if (lVar7 < 100) {
    lVar5 = lVar8;
  }
  lVar8 = 99;
  if (lVar9 < 99) {
    lVar8 = lVar9;
  }
  pcVar10 = vdl;
  if ((int)uVar11 < 0) {
    uVar14 = (ulong)(uVar11 & 0x1fffffff);
    __format = "%02ld%03ld%s%08X%s";
  }
  else if (print_eff == '\x01') {
    uVar14 = (ulong)(uVar11 & 0x7ff);
    __format = "%02ld%03ld%s---- %03X%s";
  }
  else {
    uVar14 = (ulong)(uVar11 & 0x7ff);
    __format = "%02ld%03ld%s%03X%s";
    pcVar10 = " | ";
  }
  printf(__format,lVar8,lVar5 / 1000,pcVar10,uVar14,pcVar10);
  iVar13 = (uint)bVar1 - (uint)bVar2;
  if (binary == '\0') {
    for (uVar14 = 0; bVar1 = sniftab[lVar4].current.len, uVar14 < bVar1; uVar14 = uVar14 + 1) {
      if ((color == '\x01') &&
         ((~*(byte *)(lVar12 + 0x106298 + uVar14) & *(byte *)(lVar12 + 0x106250 + uVar14)) != 0)) {
        printf("%s%02X%s ","\x1b[1m\x1b[31m",(ulong)*(byte *)(lVar12 + 0x106208 + uVar14),"\x1b[0m")
        ;
      }
      else {
        printf("%02X ");
      }
    }
    if (print_ascii == 0) {
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
        printf("   ");
      }
    }
    else {
      uVar11 = 8;
      if (max_dlen != '\0') {
        uVar11 = 0x40;
      }
      iVar6 = uVar11 - bVar1;
      if (bVar1 <= uVar11 && iVar6 != 0) {
        printf("%*s",(ulong)(uint)(iVar6 * 3),"");
      }
      for (uVar14 = 0; uVar14 < sniftab[lVar4].current.len; uVar14 = uVar14 + 1) {
        bVar1 = *(byte *)(lVar12 + 0x106208 + uVar14);
        if ((byte)(bVar1 - 0x20) < 0x5f) {
          if ((color != '\x01') ||
             ((~*(byte *)(lVar12 + 0x106298 + uVar14) & *(byte *)(lVar12 + 0x106250 + uVar14)) == 0)
             ) {
            uVar11 = (uint)bVar1;
            goto LAB_001029e6;
          }
          printf("%s%c%s","\x1b[1m\x1b[31m",(ulong)bVar1,"\x1b[0m");
        }
        else {
          uVar11 = 0x2e;
LAB_001029e6:
          putchar(uVar11);
        }
      }
      iVar6 = 0;
      if (0 < iVar13) {
        iVar6 = iVar13;
      }
      while (iVar6 != 0) {
        putchar(0x20);
        iVar6 = iVar6 + -1;
      }
    }
  }
  else {
    for (uVar14 = 0; uVar14 < sniftab[lVar4].current.len; uVar14 = uVar14 + 1) {
      for (uVar11 = 7; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
        if (color == '\0') {
          uVar3 = 1 << ((byte)uVar11 & 0x1f);
LAB_00102827:
          if ((uVar3 & *(byte *)(lVar12 + 0x106208 + uVar14)) == 0) {
            iVar6 = 0x30;
          }
          else {
            iVar6 = 0x31;
          }
          putchar(iVar6);
        }
        else {
          uVar3 = 1 << ((byte)uVar11 & 0x1f);
          if (((*(byte *)(lVar12 + 0x106250 + uVar14) >> (uVar11 & 0x1f) & 1) == 0) ||
             ((uVar3 & *(byte *)(lVar12 + 0x106298 + uVar14)) != 0)) goto LAB_00102827;
          if ((uVar3 & *(byte *)(lVar12 + 0x106208 + uVar14)) == 0) {
            pcVar10 = "%s0%s";
          }
          else {
            pcVar10 = "%s1%s";
          }
          printf(pcVar10,"\x1b[1m\x1b[31m","\x1b[0m");
        }
      }
      if (binary_gap == '\x01') {
        putchar(0x20);
      }
    }
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
      printf("        ");
      if (binary_gap == '\x01') {
        putchar(0x20);
      }
    }
  }
  putchar(10);
  __n = 8;
  if (max_dlen != '\0') {
    __n = 0x40;
  }
  memset(sniftab[lVar4].marker.data,0,__n);
  return;
}

Assistant:

void print_snifline(int slot)
{
	long diffsec  = sniftab[slot].currstamp.tv_sec  - sniftab[slot].laststamp.tv_sec;
	long diffusec = sniftab[slot].currstamp.tv_usec - sniftab[slot].laststamp.tv_usec;
	int dlc_diff  = sniftab[slot].last.len - sniftab[slot].current.len;
	canid_t cid = sniftab[slot].current.can_id;
	int i,j;

	if (diffusec < 0)
		diffsec--, diffusec += 1000000;

	if (diffsec < 0)
		diffsec = diffusec = 0;

	if (diffsec >= 100)
		diffsec = 99, diffusec = 999999;

	if (cid & CAN_EFF_FLAG)
		printf("%02ld%03ld%s%08X%s", diffsec, diffusec/1000, vdl, cid & CAN_EFF_MASK, vdl);
	else if (print_eff)
		printf("%02ld%03ld%s---- %03X%s", diffsec, diffusec/1000, vdl, cid & CAN_SFF_MASK, vdl);
	else
		printf("%02ld%03ld%s%03X%s", diffsec, diffusec/1000, ldl, cid & CAN_SFF_MASK, ldl);

	if (binary) {
		for (i = 0; i < sniftab[slot].current.len; i++) {
			for (j=7; j >= 0; j--) {
				if ((color) && (sniftab[slot].marker.data[i] & 1<<j) &&
				    (!(sniftab[slot].notch.data[i] & 1<<j)))
					if (sniftab[slot].current.data[i] & 1<<j)
						printf("%s1%s", ATTCOLOR, ATTRESET);
					else
						printf("%s0%s", ATTCOLOR, ATTRESET);
				else
					if (sniftab[slot].current.data[i] & 1<<j)
						putchar('1');
					else
						putchar('0');
			}
			if (binary_gap)
				putchar(' ');
		}

		/*
		 * when the len decreased (dlc_diff > 0),
		 * we need to blank the former data printout
		 */
		for (i = 0; i < dlc_diff; i++) {
			printf("        ");
			if (binary_gap)
				putchar(' ');
		}

	} else { /* not binary -> hex data and ASCII output */

		for (i = 0; i < sniftab[slot].current.len; i++)
			if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
				printf("%s%02X%s ", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
			else
				printf("%02X ", sniftab[slot].current.data[i]);

		if (print_ascii) {
			/* jump to common start for ASCII output */
			if (sniftab[slot].current.len < max_dlen)
				printf("%*s", (max_dlen - sniftab[slot].current.len) * 3, "");

			for (i = 0; i < sniftab[slot].current.len; i++)
				if ((sniftab[slot].current.data[i] > 0x1F) &&
				    (sniftab[slot].current.data[i] < 0x7F))
					if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
						printf("%s%c%s", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
					else
						putchar(sniftab[slot].current.data[i]);
				else
					putchar('.');

			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				putchar(' ');
		} else {
			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				printf("   ");
		}
	}

	putchar('\n');

	memset(&sniftab[slot].marker.data, 0, max_dlen);
}